

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz.h
# Opt level: O1

szind_t sz_size2index_compute(size_t size)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  
  if (size < 0x7000000000000001) {
    uVar1 = size * 2 - 1;
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar3 = (uint)lVar2;
    iVar5 = uVar3 - 6;
    if (uVar3 < 6) {
      iVar5 = 0;
    }
    bVar4 = 4;
    if (6 < uVar3) {
      bVar4 = (char)lVar2 - 3;
    }
    return ((uint)(((size - 1 >> (bVar4 & 0x3f)) << (bVar4 & 0x3f)) >> (bVar4 & 0x3f)) & 3) +
           iVar5 * 4 + 1;
  }
  return 0xe8;
}

Assistant:

static inline szind_t
sz_size2index_compute(size_t size) {
	if (unlikely(size > SC_LARGE_MAXCLASS)) {
		return SC_NSIZES;
	}

	if (size == 0) {
		return 0;
	}
#if (SC_NTINY != 0)
	if (size <= (ZU(1) << SC_LG_TINY_MAXCLASS)) {
		szind_t lg_tmin = SC_LG_TINY_MAXCLASS - SC_NTINY + 1;
		szind_t lg_ceil = lg_floor(pow2_ceil_zu(size));
		return (lg_ceil < lg_tmin ? 0 : lg_ceil - lg_tmin);
	}
#endif
	{
		szind_t x = lg_floor((size<<1)-1);
		szind_t shift = (x < SC_LG_NGROUP + LG_QUANTUM) ? 0 :
		    x - (SC_LG_NGROUP + LG_QUANTUM);
		szind_t grp = shift << SC_LG_NGROUP;

		szind_t lg_delta = (x < SC_LG_NGROUP + LG_QUANTUM + 1)
		    ? LG_QUANTUM : x - SC_LG_NGROUP - 1;

		size_t delta_inverse_mask = ZU(-1) << lg_delta;
		szind_t mod = ((((size-1) & delta_inverse_mask) >> lg_delta)) &
		    ((ZU(1) << SC_LG_NGROUP) - 1);

		szind_t index = SC_NTINY + grp + mod;
		return index;
	}
}